

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.cpp
# Opt level: O1

void __thiscall gui::Gui::draw(Gui *this)

{
  RenderTarget *in_RSI;
  undefined1 in_stack_00000008 [104];
  
  draw((Gui *)&this[-1].lastWidgetsUnderMouse_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       ,in_RSI,(RenderStates)in_stack_00000008);
  return;
}

Assistant:

void Gui::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (redrawPending_) {
        GUI_DEBUG << "Gui redraw...\n";
        renderTexture_.clear({0, 0, 0, 0});
        for (const auto& child : getChildren()) {
            renderTexture_.draw(*child);
        }
        renderTexture_.display();
        redrawPending_ = false;
    }

    target.draw(renderSprite_, states);
}